

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::SigmoidKernel::ByteSizeLong(SigmoidKernel *this)

{
  int iVar1;
  void *extraout_RDX;
  void *in_RSI;
  double in_XMM0_Qa;
  double dVar2;
  double extraout_XMM0_Qa;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  SigmoidKernel *this_local;
  
  sStack_18 = 0;
  dVar2 = gamma(this,in_XMM0_Qa);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    sStack_18 = 9;
  }
  c(this,in_RSI,extraout_RDX);
  if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
    sStack_18 = sStack_18 + 9;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t SigmoidKernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SigmoidKernel)
  size_t total_size = 0;

  // double gamma = 1;
  if (this->gamma() != 0) {
    total_size += 1 + 8;
  }

  // double c = 2;
  if (this->c() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}